

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a2a.cc
# Opt level: O0

void __thiscall bsplib::A2A::exchange(A2A *this)

{
  size_t sVar1;
  ulong uVar2;
  MPI_Comm poVar3;
  bool bVar4;
  unsigned_long uVar5;
  unsigned_long *puVar6;
  unsigned_long *puVar7;
  reference pvVar8;
  iterator __first;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last;
  reference puVar9;
  char *pcVar10;
  char *pcVar11;
  value_type vVar12;
  reference ppoVar13;
  size_type sVar14;
  ompi_request_t **ppoVar15;
  int *piVar16;
  A2A *pAVar17;
  long lVar18;
  void *__buf;
  void *__buf_00;
  undefined8 uVar19;
  int local_14c;
  int local_148;
  int p_7;
  int p_6;
  int tag_1;
  size_t send_size;
  int p_5;
  int tag;
  size_t recv_size;
  int p_4;
  bool first_time;
  unsigned_long uStack_118;
  int outcount;
  size_t ro;
  size_t so;
  unsigned_long uStack_100;
  int p_3;
  size_t s;
  size_t o2;
  size_t o1;
  size_t size_2;
  size_t o;
  unsigned_long uStack_d0;
  int p_2;
  size_t size_1;
  unsigned_long uStack_c0;
  int p_1;
  size_t size;
  unsigned_long uStack_b0;
  int p;
  size_t sm;
  size_t global_comm_recv [3];
  size_t local_88;
  size_t global_comm_send [3];
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_58;
  unsigned_long local_50;
  size_t max_send;
  int local_3c;
  unsigned_long uStack_38;
  int i_1;
  size_t pref_bruck_vol;
  size_t sStack_28;
  int i;
  size_t new_cap;
  size_t max_bruck_vol;
  size_t max_recv;
  A2A *this_local;
  
  max_bruck_vol = 0;
  new_cap = 0;
  sStack_28 = this->m_send_cap;
  max_recv = (size_t)this;
  puVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data(&this->m_send_sizes);
  puVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data(&this->m_recv_sizes);
  uVar19 = 8;
  MPI_Alltoall(puVar6,8,&ompi_mpi_byte,puVar7,8,&ompi_mpi_byte,this->m_comm);
  LinCost::reset(&this->m_lincost,this->m_nprocs);
  for (pref_bruck_vol._4_4_ = 0; pref_bruck_vol._4_4_ < this->m_nprocs;
      pref_bruck_vol._4_4_ = pref_bruck_vol._4_4_ + 1) {
    pAVar17 = this;
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_send_sizes,(long)pref_bruck_vol._4_4_);
    if (*pvVar8 != 0) {
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->m_send_sizes,(long)pref_bruck_vol._4_4_);
      LinCost::send(&this->m_lincost,(int)*pvVar8,__buf,(size_t)pAVar17,(int)uVar19);
    }
  }
  uStack_38 = LinCost::get_bruck_vol(&this->m_lincost);
  LinCost::reset(&this->m_lincost,this->m_nprocs);
  for (local_3c = 0; local_3c < this->m_nprocs; local_3c = local_3c + 1) {
    pAVar17 = this;
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_recv_sizes,(long)local_3c);
    if (*pvVar8 != 0) {
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->m_recv_sizes,(long)local_3c);
      LinCost::send(&this->m_lincost,(int)*pvVar8,__buf_00,(size_t)pAVar17,(int)uVar19);
    }
  }
  max_send = LinCost::get_bruck_vol(&this->m_lincost);
  puVar6 = std::max<unsigned_long>(&stack0xffffffffffffffc8,&max_send);
  uStack_38 = *puVar6;
  __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->m_send_sizes);
  global_comm_send[2] =
       (size_t)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         (&this->m_send_sizes);
  __last = __gnu_cxx::
           __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)(global_comm_send + 2),(long)this->m_nprocs);
  local_58 = std::
             max_element<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                       (__first._M_current,__last);
  puVar9 = __gnu_cxx::
           __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           ::operator*(&local_58);
  global_comm_send[0] = *puVar9;
  local_88 = this->m_send_cap;
  global_comm_send[1] = uStack_38;
  local_50 = global_comm_send[0];
  MPI_Allreduce(&local_88,&sm,3,&ompi_mpi_unsigned_long,&ompi_mpi_op_max,this->m_comm);
  sStack_28 = sm;
  max_bruck_vol = global_comm_recv[0];
  new_cap = global_comm_recv[1];
  if (((this->m_method == RMA) && (sm != this->m_recv_cap)) &&
     (this->m_recv_win != (MPI_Win)&ompi_mpi_win_null)) {
    MPI_Win_free(&this->m_recv_win);
  }
  std::vector<char,_std::allocator<char>_>::resize
            (&this->m_recv_bufs,sStack_28 * (long)this->m_nprocs);
  if ((this->m_method == RMA) && (sStack_28 != this->m_recv_cap)) {
    pcVar10 = std::vector<char,_std::allocator<char>_>::data(&this->m_recv_bufs);
    MPI_Win_create(pcVar10,sStack_28 * (long)this->m_nprocs,1,&ompi_mpi_info_null,this->m_comm,
                   &this->m_recv_win);
  }
  this->m_recv_cap = sStack_28;
  if (this->m_recv_cap < max_bruck_vol) {
    __assert_fail("m_recv_cap >= max_recv",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/a2a.cc"
                  ,0xa8,"void bsplib::A2A::exchange()");
  }
  if (max_bruck_vol == 0) {
    clear(this);
  }
  else {
    puVar6 = std::min<unsigned_long>(&new_cap,&this->m_small_a2a_size_per_proc);
    uStack_b0 = *puVar6;
    for (size._4_4_ = 0; size._4_4_ < this->m_nprocs; size._4_4_ = size._4_4_ + 1) {
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->m_send_sizes,(long)size._4_4_);
      puVar6 = std::min<unsigned_long>(&stack0xffffffffffffff50,pvVar8);
      uStack_c0 = *puVar6;
      pcVar10 = std::vector<char,_std::allocator<char>_>::data(&this->m_small_send_buf);
      lVar18 = (long)size._4_4_ * uStack_b0;
      pcVar11 = std::vector<char,_std::allocator<char>_>::data(&this->m_send_bufs);
      memcpy(pcVar10 + lVar18,pcVar11 + (long)size._4_4_ * this->m_send_cap,uStack_c0);
    }
    pcVar10 = std::vector<char,_std::allocator<char>_>::data(&this->m_small_send_buf);
    uVar2 = uStack_b0;
    pcVar11 = std::vector<char,_std::allocator<char>_>::data(&this->m_small_recv_buf);
    MPI_Alltoall(pcVar10,uVar2 & 0xffffffff,&ompi_mpi_byte,pcVar11,uStack_b0 & 0xffffffff,
                 &ompi_mpi_byte,this->m_comm);
    for (size_1._4_4_ = 0; size_1._4_4_ < this->m_nprocs; size_1._4_4_ = size_1._4_4_ + 1) {
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->m_recv_sizes,(long)size_1._4_4_);
      puVar6 = std::min<unsigned_long>(&stack0xffffffffffffff50,pvVar8);
      uStack_d0 = *puVar6;
      pcVar10 = std::vector<char,_std::allocator<char>_>::data(&this->m_recv_bufs);
      lVar18 = (long)size_1._4_4_;
      sVar1 = this->m_recv_cap;
      pcVar11 = std::vector<char,_std::allocator<char>_>::data(&this->m_small_recv_buf);
      memcpy(pcVar10 + lVar18 * sVar1,pcVar11 + (long)size_1._4_4_ * uStack_b0,uStack_d0);
    }
    if (this->m_method == RMA) {
      if (this->m_recv_cap == 0) {
        __assert_fail("m_recv_cap > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/a2a.cc"
                      ,0xce,"void bsplib::A2A::exchange()");
      }
      if (this->m_recv_win == (MPI_Win)&ompi_mpi_win_null) {
        __assert_fail("m_recv_win != MPI_WIN_NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/a2a.cc"
                      ,0xcf,"void bsplib::A2A::exchange()");
      }
      MPI_Win_fence(0,this->m_recv_win);
      for (o._4_4_ = 0; o._4_4_ < this->m_nprocs; o._4_4_ = o._4_4_ + 1) {
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->m_send_sizes,(long)o._4_4_);
        puVar6 = std::min<unsigned_long>(&stack0xffffffffffffff50,pvVar8);
        size_2 = *puVar6;
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->m_send_sizes,(long)o._4_4_);
        o2 = this->m_send_cap * (long)o._4_4_ + size_2;
        s = this->m_recv_cap * (long)this->m_pid + size_2;
        for (o1 = *pvVar8 - size_2; o1 != 0; o1 = o1 - uStack_100) {
          puVar6 = std::min<unsigned_long>(&this->m_max_msg_size,&o1);
          uStack_100 = *puVar6;
          pcVar10 = std::vector<char,_std::allocator<char>_>::data(&this->m_send_bufs);
          MPI_Put(pcVar10 + o2,uStack_100 & 0xffffffff,&ompi_mpi_byte,o._4_4_,s,
                  uStack_100 & 0xffffffff,&ompi_mpi_byte,this->m_recv_win);
          o2 = uStack_100 + o2;
          s = uStack_100 + s;
        }
      }
      MPI_Win_fence(0,this->m_recv_win);
    }
    else if (this->m_method == MSG) {
      for (so._4_4_ = 0; so._4_4_ < this->m_nprocs; so._4_4_ = so._4_4_ + 1) {
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->m_send_sizes,(long)so._4_4_);
        puVar6 = std::min<unsigned_long>(&stack0xffffffffffffff50,pvVar8);
        ro = *puVar6;
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->m_recv_sizes,(long)so._4_4_);
        puVar6 = std::min<unsigned_long>(&stack0xffffffffffffff50,pvVar8);
        sVar1 = ro;
        uStack_118 = *puVar6;
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->m_send_sizes,(long)so._4_4_);
        *pvVar8 = *pvVar8 - sVar1;
        vVar12 = (long)so._4_4_ * this->m_send_cap + ro;
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->m_send_pos,(long)so._4_4_);
        uVar5 = uStack_118;
        *pvVar8 = vVar12;
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->m_recv_sizes,(long)so._4_4_);
        *pvVar8 = *pvVar8 - uVar5;
        vVar12 = (long)so._4_4_ * this->m_recv_cap + uStack_118;
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->m_recv_pos,(long)so._4_4_);
        *pvVar8 = vVar12;
      }
      p_4 = -0x7ffe;
      bVar4 = true;
      do {
        for (recv_size._4_4_ = 0; recv_size._4_4_ < this->m_nprocs;
            recv_size._4_4_ = recv_size._4_4_ + 1) {
          ppoVar13 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::operator[]
                               (&this->m_reqs,(long)recv_size._4_4_);
          if (*ppoVar13 == (value_type)&ompi_request_null) {
            pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&this->m_recv_sizes,(long)recv_size._4_4_);
            puVar6 = std::min<unsigned_long>(&this->m_max_msg_size,pvVar8);
            uVar2 = *puVar6;
            if (uVar2 != 0) {
              pcVar10 = std::vector<char,_std::allocator<char>_>::data(&this->m_recv_bufs);
              pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (&this->m_recv_pos,(long)recv_size._4_4_);
              vVar12 = *pvVar8;
              poVar3 = this->m_comm;
              ppoVar13 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::
                         operator[](&this->m_reqs,(long)recv_size._4_4_);
              MPI_Irecv(pcVar10 + vVar12,uVar2 & 0xffffffff,&ompi_mpi_byte,recv_size._4_4_,0,poVar3,
                        ppoVar13);
            }
            pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&this->m_recv_sizes,(long)recv_size._4_4_);
            *pvVar8 = *pvVar8 - uVar2;
            pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&this->m_recv_pos,(long)recv_size._4_4_);
            *pvVar8 = uVar2 + *pvVar8;
          }
        }
        if (bVar4) {
          MPI_Barrier(this->m_comm);
        }
        for (send_size._0_4_ = 0; (int)send_size < this->m_nprocs;
            send_size._0_4_ = (int)send_size + 1) {
          ppoVar13 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::operator[]
                               (&this->m_reqs,(long)(this->m_nprocs + (int)send_size));
          if (*ppoVar13 == (value_type)&ompi_request_null) {
            pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&this->m_send_sizes,(long)(int)send_size);
            puVar6 = std::min<unsigned_long>(&this->m_max_msg_size,pvVar8);
            uVar2 = *puVar6;
            if (uVar2 != 0) {
              if (bVar4) {
                pcVar10 = std::vector<char,_std::allocator<char>_>::data(&this->m_send_bufs);
                pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (&this->m_send_pos,(long)(int)send_size);
                vVar12 = *pvVar8;
                poVar3 = this->m_comm;
                ppoVar13 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::
                           operator[](&this->m_reqs,(long)(this->m_nprocs + (int)send_size));
                MPI_Irsend(pcVar10 + vVar12,uVar2 & 0xffffffff,&ompi_mpi_byte,(int)send_size,0,
                           poVar3,ppoVar13);
              }
              else {
                pcVar10 = std::vector<char,_std::allocator<char>_>::data(&this->m_send_bufs);
                pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (&this->m_send_pos,(long)(int)send_size);
                vVar12 = *pvVar8;
                poVar3 = this->m_comm;
                ppoVar13 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::
                           operator[](&this->m_reqs,(long)(this->m_nprocs + (int)send_size));
                MPI_Isend(pcVar10 + vVar12,uVar2 & 0xffffffff,&ompi_mpi_byte,(int)send_size,0,poVar3
                          ,ppoVar13);
              }
            }
            pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&this->m_send_sizes,(long)(int)send_size);
            *pvVar8 = *pvVar8 - uVar2;
            pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&this->m_send_pos,(long)(int)send_size);
            *pvVar8 = uVar2 + *pvVar8;
          }
        }
        bVar4 = false;
        sVar14 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::size
                           (&this->m_reqs);
        ppoVar15 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::data
                             (&this->m_reqs);
        piVar16 = std::vector<int,_std::allocator<int>_>::data(&this->m_ready);
        MPI_Waitsome(sVar14 & 0xffffffff,ppoVar15,&p_4,piVar16,0);
      } while (p_4 != -0x7ffe);
      for (local_148 = 0; local_148 < this->m_nprocs; local_148 = local_148 + 1) {
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->m_recv_sizes,(long)local_148);
        if (*pvVar8 != 0) {
          __assert_fail("m_recv_sizes[p] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/a2a.cc"
                        ,0x134,"void bsplib::A2A::exchange()");
        }
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->m_send_sizes,(long)local_148);
        if (*pvVar8 != 0) {
          __assert_fail("m_send_sizes[p] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/a2a.cc"
                        ,0x135,"void bsplib::A2A::exchange()");
        }
        ppoVar13 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::operator[]
                             (&this->m_reqs,(long)local_148);
        if (*ppoVar13 != (value_type)&ompi_request_null) {
          __assert_fail("m_reqs[p] == MPI_REQUEST_NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/a2a.cc"
                        ,0x136,"void bsplib::A2A::exchange()");
        }
        ppoVar13 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::operator[]
                             (&this->m_reqs,(long)(this->m_nprocs + local_148));
        if (*ppoVar13 != (value_type)&ompi_request_null) {
          __assert_fail("m_reqs[m_nprocs+p] == MPI_REQUEST_NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/a2a.cc"
                        ,0x137,"void bsplib::A2A::exchange()");
        }
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->m_recv_pos,(long)local_148);
        vVar12 = *pvVar8;
        sVar1 = this->m_recv_cap;
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->m_recv_sizes,(long)local_148);
        *pvVar8 = vVar12 - (long)local_148 * sVar1;
      }
    }
  }
  this->m_send_cap = this->m_recv_cap;
  std::vector<char,_std::allocator<char>_>::resize
            (&this->m_send_bufs,(long)this->m_nprocs * this->m_send_cap);
  for (local_14c = 0; local_14c < this->m_nprocs; local_14c = local_14c + 1) {
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_send_sizes,(long)local_14c);
    *pvVar8 = 0;
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_send_pos,(long)local_14c);
    *pvVar8 = 0;
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_recv_pos,(long)local_14c);
    *pvVar8 = 0;
  }
  return;
}

Assistant:

void A2A::exchange( )
{
    std::size_t max_recv = 0, max_bruck_vol = 0;
    std::size_t new_cap = m_send_cap;
    {   
#ifdef PROFILE
        TicToc t( TicToc::MPI_META_A2A, 4*sizeof(std::size_t)*m_nprocs );
#endif

        // exchange data sizes. 
        MPI_Alltoall( m_send_sizes.data(), sizeof(std::size_t), MPI_BYTE,
                m_recv_sizes.data(), sizeof(std::size_t), MPI_BYTE,
                m_comm );

        // determine ideal nr of bytes to send over MPI_Alltoall
        m_lincost.reset( m_nprocs );
        for ( int i = 0; i < m_nprocs; ++i ) 
            if ( m_send_sizes[i] > 0 )
                m_lincost.send( m_send_sizes[i]);

        std::size_t pref_bruck_vol = m_lincost.get_bruck_vol();

        m_lincost.reset( m_nprocs );
        for ( int i = 0; i < m_nprocs; ++i ) 
            if ( m_recv_sizes[i] > 0 )
                m_lincost.send( m_recv_sizes[i]);

        // Determine max communication sizes
        pref_bruck_vol = 
            std::max( pref_bruck_vol, m_lincost.get_bruck_vol() );

        std::size_t max_send = *std::max_element( m_send_sizes.begin(),
                               m_send_sizes.begin() + m_nprocs );

        std::size_t global_comm_send[3] = 
            { m_send_cap, max_send, pref_bruck_vol };
        std::size_t global_comm_recv[3];

        MPI_Allreduce( global_comm_send, global_comm_recv,
                3, MY_MPI_SIZE_T, MPI_MAX, m_comm );

        new_cap       = global_comm_recv[0];
        max_recv      = global_comm_recv[1];
        max_bruck_vol = global_comm_recv[2];
    }

    // Ensure correct size memory of recv buffers
    if ( m_method == RMA && 
            new_cap != m_recv_cap && m_recv_win != MPI_WIN_NULL )
        MPI_Win_free( &m_recv_win );

    m_recv_bufs.resize( new_cap * m_nprocs );

    if ( m_method == RMA && new_cap != m_recv_cap ) {
        MPI_Win_create( m_recv_bufs.data(), 
                new_cap * m_nprocs, 1, 
                MPI_INFO_NULL, m_comm, &m_recv_win );
    }
    m_recv_cap = new_cap;

    assert( m_recv_cap >= max_recv );

    if ( max_recv == 0 ) {
        /* no need to do anything */
        clear();
    }
    else  {
        std::size_t sm = std::min( max_bruck_vol, m_small_a2a_size_per_proc ) ;
        {
#ifdef PROFILE
        TicToc t( TicToc::MPI_SMALL_A2A );
#endif
        for (int p = 0; p < m_nprocs; ++p ) {
            std::size_t size = std::min( sm, m_send_sizes[p]);
            memcpy( m_small_send_buf.data() + p * sm,
                    m_send_bufs.data() + p * m_send_cap,
                    size);
#ifdef PROFILE
            t.add_bytes( sm );
#endif
        }
        // In small exchanges, Bruck's algorithm will be used again
        MPI_Alltoall( m_small_send_buf.data(), int(sm), MPI_BYTE,
                m_small_recv_buf.data(), int(sm), MPI_BYTE,
                m_comm );

        for (int p = 0; p < m_nprocs; ++p ) {
            std::size_t size = std::min( sm, m_recv_sizes[p]);
            memcpy( m_recv_bufs.data() + p * m_recv_cap,
                    m_small_recv_buf.data() + p * sm,
                    size );
        }
        } // end plain all-to-all
        // start normal message exchange
        if ( m_method == RMA) { 
#ifdef PROFILE
        TicToc t( TicToc::MPI_PUT );
#endif
        assert( m_recv_cap > 0 );
        assert( m_recv_win != MPI_WIN_NULL );

        MPI_Win_fence( 0, m_recv_win );

        for (int p = 0; p < m_nprocs; ++p ) {
            std::size_t o = std::min( sm, m_send_sizes[p] );
            std::size_t size = m_send_sizes[p] - o;
            std::size_t o1 = m_send_cap * p + o;
            std::size_t o2 = m_recv_cap * m_pid + o;
#ifdef PROFILE
            t.add_bytes( size );
#endif
            while ( size > 0 ) {
                std::size_t s = std::min( m_max_msg_size, size );
                //size_t s = size;
                MPI_Put( m_send_bufs.data() + o1, int(s), MPI_BYTE,
                        p, o2, int(s), MPI_BYTE, m_recv_win );
                size -= s;
                o1 += s;
                o2 += s;
            }
        }

        MPI_Win_fence( 0, m_recv_win );
        } else if ( m_method == MSG ) {

#ifdef PROFILE
        TicToc tr( TicToc::MPI_LARGE_RECV );
        TicToc ts( TicToc::MPI_LARGE_SEND );
#endif

        for ( int p = 0 ; p < m_nprocs; ++p ) {
            std::size_t so = std::min( sm, m_send_sizes[p] );
            std::size_t ro = std::min( sm, m_recv_sizes[p] );

            m_send_sizes[p] -= so;
            m_send_pos[p] = p * m_send_cap + so;

            m_recv_sizes[p] -= ro;
            m_recv_pos[p] = p * m_recv_cap + ro;
        }

        // Do a personalized exchange
        int outcount = MPI_UNDEFINED;
        bool first_time = true;
        do {
            for (int p = 0; p < m_nprocs; ++p ) {
                if (m_reqs[p] != MPI_REQUEST_NULL) continue;

                std::size_t recv_size 
                    = std::min( m_max_msg_size, m_recv_sizes[p] );
#ifdef PROFILE
                tr.add_bytes( recv_size );
#endif

                int tag = 0;
                if (recv_size > 0 )
                    MPI_Irecv( m_recv_bufs.data() + m_recv_pos[p],
                            int( recv_size ), MPI_BYTE, p,
                            tag, m_comm, & m_reqs[p] );
                
                m_recv_sizes[p] -= recv_size;
                m_recv_pos[p] += recv_size;
            }

            if (first_time)
                MPI_Barrier( m_comm ); // Using the barrier the first time
                                       // allows to use ready sends

            for (int p = 0; p < m_nprocs; ++p ) {
                if (m_reqs[m_nprocs + p] != MPI_REQUEST_NULL) continue;

                std::size_t send_size 
                    = std::min( m_max_msg_size, m_send_sizes[p] );
#ifdef PROFILE
                ts.add_bytes( send_size );
#endif

                int tag = 0;
                if (send_size > 0 ) {
                    if (first_time)
                     MPI_Irsend( m_send_bufs.data() + m_send_pos[p],
                            int( send_size ), MPI_BYTE, p,
                            tag, m_comm, & m_reqs[m_nprocs + p ] );
                    else
                     MPI_Isend( m_send_bufs.data() + m_send_pos[p],
                            int( send_size ), MPI_BYTE, p,
                            tag, m_comm, & m_reqs[m_nprocs + p ] );
                }
                
                m_send_sizes[p] -= send_size;
                m_send_pos[p] += send_size;
            }
            
            first_time = false;

            MPI_Waitsome( int( m_reqs.size() ), m_reqs.data(), &outcount, 
                    m_ready.data(), MPI_STATUSES_IGNORE );
        } while (outcount != MPI_UNDEFINED );

        for (int p = 0 ; p < m_nprocs; ++p ) {
            assert( m_recv_sizes[p] == 0 );
            assert( m_send_sizes[p] == 0 );
            assert( m_reqs[p] == MPI_REQUEST_NULL );
            assert( m_reqs[m_nprocs+p] == MPI_REQUEST_NULL );
            m_recv_sizes[p] = m_recv_pos[p] - p * m_recv_cap;
        }
    } // end of plain message exchange
    } // end of else

    m_send_cap = m_recv_cap;
    m_send_bufs.resize( m_nprocs * m_send_cap );
    for (int p = 0 ; p < m_nprocs; ++p ) {
        m_send_sizes[p] = 0;
        m_send_pos[p] = 0;
        m_recv_pos[p] = 0;
    }
}